

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

int firstNamelessRecord(int m,int firstcode)

{
  int m_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  iVar1 = coDex(m);
  lVar4 = (long)m;
  piVar3 = &TERRITORY_BOUNDARIES[lVar4].flags;
  do {
    m_00 = (int)lVar4;
    if (lVar4 < firstcode) break;
    iVar2 = coDex(m_00);
    if (iVar2 != iVar1) break;
    lVar4 = lVar4 + -1;
    iVar2 = *piVar3;
    piVar3 = piVar3 + -5;
  } while ((iVar2 & 0x40) != 0);
  return m_00 + 1;
}

Assistant:

static int firstNamelessRecord(const int m, const int firstcode) {
    int i = m;
    const int codexm = coDex(m);
    ASSERT((0 <= m) && (m <= MAPCODE_BOUNDARY_MAX));
    ASSERT((0 <= firstcode) && (firstcode <= MAPCODE_BOUNDARY_MAX));
    while (i >= firstcode && coDex(i) == codexm && IS_NAMELESS(i)) {
        i--;
    }
    return (i + 1);
}